

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::MultiTexShader::shadeVertices
          (MultiTexShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  Vector<float,_4> local_50;
  undefined8 local_40;
  undefined8 local_38;
  VertexPacket *local_30;
  VertexPacket *packet;
  int packetNdx;
  int numPackets_local;
  VertexPacket **packets_local;
  VertexAttrib *inputs_local;
  MultiTexShader *this_local;
  
  packet._4_4_ = numPackets;
  _packetNdx = packets;
  packets_local = (VertexPacket **)inputs;
  inputs_local = (VertexAttrib *)this;
  for (packet._0_4_ = 0; (int)packet < packet._4_4_; packet._0_4_ = (int)packet + 1) {
    local_30 = _packetNdx[(int)packet];
    rr::readVertexAttribFloat
              ((rr *)&local_40,(VertexAttrib *)packets_local,local_30->instanceNdx,
               local_30->vertexNdx);
    *(undefined8 *)(local_30->position).m_data = local_40;
    *(undefined8 *)((local_30->position).m_data + 2) = local_38;
    rr::readVertexAttribFloat
              ((rr *)&local_50,(VertexAttrib *)(packets_local + 5),local_30->instanceNdx,
               local_30->vertexNdx);
    rr::GenericVec4::operator=(local_30->outputs,&local_50);
  }
  return;
}

Assistant:

void MultiTexShader::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		rr::VertexPacket& packet = *(packets[packetNdx]);

		packet.position		= rr::readVertexAttribFloat(inputs[0], packet.instanceNdx, packet.vertexNdx);
		packet.outputs[0]	= rr::readVertexAttribFloat(inputs[1], packet.instanceNdx, packet.vertexNdx);
	}
}